

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowDemoWindow(bool *p_open)

{
  char cVar1;
  ushort uVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImGuiID IVar9;
  uint uVar10;
  ImU32 IVar11;
  ImU32 IVar12;
  ImGuiMouseCursor IVar13;
  ImGuiContext_conflict1 *pIVar14;
  ImGuiViewport *pIVar15;
  ImGuiIO *pIVar16;
  MyDocument *pMVar17;
  MyDocument **ppMVar18;
  char *pcVar19;
  ImDrawList *pIVar20;
  ImGuiStyle *pIVar21;
  ImVec2 *pIVar22;
  unsigned_short *puVar23;
  int doc_n;
  uint uVar24;
  int iVar25;
  ImGuiCond cond;
  bool *pbVar26;
  int open_count;
  int iVar27;
  ImGuiWindowFlags flags;
  char *pcVar28;
  int i_16;
  undefined8 *puVar29;
  int i_5;
  int iVar30;
  long lVar31;
  ulong uVar32;
  int doc_n_3;
  undefined **ppuVar33;
  float fVar34;
  float fVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar36;
  float local_148;
  float fStack_144;
  float local_138;
  float fStack_134;
  ImVec2 canvas_sz;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 gradient_size;
  float local_108;
  float fStack_104;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  MyDocument *doc;
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  ImVec2 local_58;
  float local_4c;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  bool *local_38;
  
  local_38 = p_open;
  pIVar14 = GetCurrentContext();
  if (pIVar14 == (ImGuiContext_conflict1 *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                  ,0x112,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar6 = BeginMainMenuBar(), bVar6)) {
    bVar6 = BeginMenu("File",true);
    if (bVar6) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar6 = BeginMenu("Edit",true);
    if (bVar6) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_dockspace == true) {
    if (ShowExampleAppDockSpace(bool*)::opt_fullscreen == '\x01') {
      pIVar15 = GetMainViewport();
      doc = (MyDocument *)0x0;
      SetNextWindowPos(&pIVar15->WorkPos,0,(ImVec2 *)&doc);
      SetNextWindowSize(&pIVar15->WorkSize,0);
      SetNextWindowViewport(pIVar15->ID);
      PushStyleVar(3,0.0);
      PushStyleVar(4,0.0);
      uVar10 = 0x282427;
    }
    else {
      ShowExampleAppDockSpace(bool*)::dockspace_flags =
           ShowExampleAppDockSpace(bool*)::dockspace_flags & 0xfffffff7;
      uVar10 = 0x200400;
    }
    uVar24 = ShowExampleAppDockSpace(bool*)::dockspace_flags & 8;
    if (ShowExampleAppDockSpace(bool*)::opt_padding == '\0') {
      doc = (MyDocument *)0x0;
      PushStyleVar(2,(ImVec2 *)&doc);
    }
    Begin("DockSpace Demo",&ShowDemoWindow::show_app_dockspace,uVar24 << 4 | uVar10);
    if (ShowExampleAppDockSpace(bool*)::opt_padding == '\0') {
      PopStyleVar(1);
    }
    if (ShowExampleAppDockSpace(bool*)::opt_fullscreen == '\x01') {
      PopStyleVar(2);
    }
    pIVar16 = GetIO();
    if ((pIVar16->ConfigFlags & 0x40) == 0) {
      ShowDockingDisabledMessage();
    }
    else {
      IVar9 = GetID("MyDockSpace");
      doc = (MyDocument *)0x0;
      DockSpace(IVar9,(ImVec2 *)&doc,ShowExampleAppDockSpace(bool*)::dockspace_flags,
                (ImGuiWindowClass *)0x0);
    }
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("Options",true);
      if (bVar6) {
        MenuItem("Fullscreen",(char *)0x0,(bool *)&ShowExampleAppDockSpace(bool*)::opt_fullscreen,
                 true);
        MenuItem("Padding",(char *)0x0,(bool *)&ShowExampleAppDockSpace(bool*)::opt_padding,true);
        Separator();
        bVar6 = MenuItem("Flag: NoSplit","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x10) >> 4,0),true
                        );
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x10;
        }
        bVar6 = MenuItem("Flag: NoResize","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x20) >> 5,0),true
                        );
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x20;
        }
        bVar6 = MenuItem("Flag: NoDockingInCentralNode","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 4) >> 2,0),true);
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 4;
        }
        bVar6 = MenuItem("Flag: AutoHideTabBar","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 0x40) >> 6,0),true
                        );
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 0x40;
        }
        bVar6 = MenuItem("Flag: PassthruCentralNode","",
                         SUB41((ShowExampleAppDockSpace(bool*)::dockspace_flags & 8) >> 3,0),
                         (bool)ShowExampleAppDockSpace(bool*)::opt_fullscreen);
        if (bVar6) {
          ShowExampleAppDockSpace(bool*)::dockspace_flags =
               ShowExampleAppDockSpace(bool*)::dockspace_flags ^ 8;
        }
        Separator();
        bVar6 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar6) {
          ShowDemoWindow::show_app_dockspace = false;
        }
        EndMenu();
      }
      HelpMarker(
                "When docking is enabled, you can ALWAYS dock MOST window into another! Try it now!\n- Drag from window title bar or their tab to dock/undock.\n- Drag from window menu button (upper-left button) to undock an entire node (all windows).\n- Hold SHIFT to disable docking (if io.ConfigDockingWithShift == false, default)\n- Hold SHIFT to enable docking (if io.ConfigDockingWithShift == true)\nThis demo app has nothing to do with enabling docking!\n\nThis demo app only demonstrate the use of ImGui::DockSpace() which allows you to manually create a docking node _within_ another window.\n\nRead comments in ShowExampleAppDockSpace() for more details."
                );
      EndMenuBar();
    }
    End();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar25 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar25 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar6 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if ((bVar6) || (ShowExampleAppDocuments(bool*)::opt_target == 2)) {
      bVar7 = BeginMenuBar();
      if (bVar7) {
        bVar7 = BeginMenu("File",true);
        if (bVar7) {
          iVar27 = 0;
          for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
            pMVar17 = ImVector<MyDocument>::operator[]
                                ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar25
                                );
            iVar27 = iVar27 + (uint)pMVar17->Open;
          }
          bVar7 = BeginMenu("Open",iVar27 < ShowExampleAppDocuments(bool*)::app);
          if (bVar7) {
            for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
              pMVar17 = ImVector<MyDocument>::operator[]
                                  ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,
                                   iVar25);
              if ((pMVar17->Open == false) &&
                 (bVar7 = MenuItem(pMVar17->Name,(char *)0x0,false,true), bVar7)) {
                pMVar17->Open = true;
              }
            }
            EndMenu();
          }
          iVar25 = 0;
          bVar7 = MenuItem("Close All Documents",(char *)0x0,false,iVar27 != 0);
          if (bVar7) {
            for (; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
              pMVar17 = ImVector<MyDocument>::operator[]
                                  ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,
                                   iVar25);
              pMVar17->WantClose = true;
            }
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      cond = 4;
      for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
        pMVar17 = ImVector<MyDocument>::operator[]
                            ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar25);
        if (iVar25 != 0) {
          SameLine(0.0,-1.0);
        }
        PushID(pMVar17);
        bVar7 = Checkbox(pMVar17->Name,&pMVar17->Open);
        if ((bVar7) && (pMVar17->Open == false)) {
          pMVar17->Open = false;
          pMVar17->Dirty = false;
        }
        PopID();
      }
      fVar34 = GetFontSize();
      PushItemWidth(fVar34 * 12.0);
      pcVar28 = "Output";
      Combo("Output",&ShowExampleAppDocuments(bool*)::opt_target,"None",-1);
      PopItemWidth();
      if (ShowExampleAppDocuments(bool*)::opt_target == 1) {
        SameLine(0.0,-1.0);
        pcVar28 = "Reorderable Tabs";
        Checkbox("Reorderable Tabs",(bool *)&ShowExampleAppDocuments(bool*)::opt_reorderable);
      }
      if (ShowExampleAppDocuments(bool*)::opt_target == 2) {
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        pcVar28 = "Redock all";
        bVar7 = Button("Redock all",(ImVec2 *)&doc);
        cond = (uint)!bVar7 + (uint)!bVar7 * 2 + 1;
      }
      Separator();
      if (ShowExampleAppDocuments(bool*)::opt_target == 2) {
        pIVar16 = GetIO();
        if ((pIVar16->ConfigFlags & 0x40) == 0) {
          ShowDockingDisabledMessage();
        }
        else {
          NotifyOfDocumentsClosedElsewhere((ExampleAppDocuments *)pcVar28);
          IVar9 = GetID("MyDockSpace");
          doc = (MyDocument *)0x0;
          DockSpace(IVar9,(ImVec2 *)&doc,0,(ImGuiWindowClass *)0x0);
          for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
            pMVar17 = ImVector<MyDocument>::operator[]
                                ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar25
                                );
            if (pMVar17->Open == true) {
              SetNextWindowDockID(IVar9,cond);
              bVar7 = Begin(pMVar17->Name,&pMVar17->Open,(uint)pMVar17->Dirty << 0x14);
              if ((pMVar17->Open == false) && (pMVar17->Dirty == true)) {
                pMVar17->Open = true;
                pMVar17->WantClose = true;
              }
              MyDocument::DisplayContextMenu(pMVar17);
              if (bVar7) {
                MyDocument::DisplayContents(pMVar17);
              }
              End();
            }
          }
        }
      }
      else if (ShowExampleAppDocuments(bool*)::opt_target == 1) {
        pcVar28 = "##tabs";
        bVar7 = BeginTabBar("##tabs",ShowExampleAppDocuments(bool*)::opt_reorderable | 0x40);
        if (bVar7) {
          if (ShowExampleAppDocuments(bool*)::opt_reorderable == 1) {
            NotifyOfDocumentsClosedElsewhere((ExampleAppDocuments *)pcVar28);
          }
          for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
            pMVar17 = ImVector<MyDocument>::operator[]
                                ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar25
                                );
            if (pMVar17->Open == true) {
              bVar7 = BeginTabItem(pMVar17->Name,&pMVar17->Open,(uint)pMVar17->Dirty);
              if ((pMVar17->Open == false) && (pMVar17->Dirty == true)) {
                pMVar17->Open = true;
                pMVar17->WantClose = true;
              }
              MyDocument::DisplayContextMenu(pMVar17);
              if (bVar7) {
                MyDocument::DisplayContents(pMVar17);
                EndTabItem();
              }
            }
          }
          EndTabBar();
        }
      }
      if (bVar6) {
        if ((ShowExampleAppDocuments(bool*)::close_queue == '\0') &&
           (iVar25 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::close_queue), iVar25 != 0)
           ) {
          _close_queue = 0;
          uRam00000000002642a8 = 0;
          __cxa_atexit(ImVector<MyDocument_*>::~ImVector,
                       &ShowExampleAppDocuments(bool*)::close_queue,&__dso_handle);
          __cxa_guard_release(&ShowExampleAppDocuments(bool*)::close_queue);
        }
        if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
          for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::app; iVar25 = iVar25 + 1) {
            doc = ImVector<MyDocument>::operator[]
                            ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar25);
            if (doc->WantClose == true) {
              doc->WantClose = false;
              ImVector<MyDocument_*>::push_back
                        ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue,&doc
                        );
            }
          }
          if (ShowExampleAppDocuments(bool*)::close_queue == 0) goto LAB_001992af;
        }
        iVar30 = 0;
        iVar25 = ShowExampleAppDocuments(bool*)::close_queue;
        for (iVar27 = 0; iVar27 < iVar25; iVar27 = iVar27 + 1) {
          ppMVar18 = ImVector<MyDocument_*>::operator[]
                               ((ImVector<MyDocument_*> *)
                                &ShowExampleAppDocuments(bool*)::close_queue,iVar27);
          iVar30 = iVar30 + (uint)(*ppMVar18)->Dirty;
          iVar25 = ShowExampleAppDocuments(bool*)::close_queue;
        }
        if (iVar30 == 0) {
          for (iVar27 = 0; iVar27 < iVar25; iVar27 = iVar27 + 1) {
            ppMVar18 = ImVector<MyDocument_*>::operator[]
                                 ((ImVector<MyDocument_*> *)
                                  &ShowExampleAppDocuments(bool*)::close_queue,iVar27);
            pMVar17 = *ppMVar18;
            pMVar17->Open = false;
            pMVar17->Dirty = false;
            iVar25 = ShowExampleAppDocuments(bool*)::close_queue;
          }
          ImVector<MyDocument_*>::clear
                    ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
        }
        else {
          bVar6 = IsPopupOpen("Save?",0);
          if (!bVar6) {
            OpenPopup("Save?",0);
          }
          bVar6 = BeginPopupModal("Save?",(bool *)0x0,0x40);
          if (bVar6) {
            Text("Save change to the following items?");
            fVar34 = GetTextLineHeightWithSpacing();
            IVar9 = GetID("frame");
            doc = (MyDocument *)CONCAT44(fVar34 * 6.25,0x80800000);
            bVar6 = BeginChildFrame(IVar9,(ImVec2 *)&doc,0);
            if (bVar6) {
              for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::close_queue;
                  iVar25 = iVar25 + 1) {
                ppMVar18 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar25);
                if ((*ppMVar18)->Dirty == true) {
                  ppMVar18 = ImVector<MyDocument_*>::operator[]
                                       ((ImVector<MyDocument_*> *)
                                        &ShowExampleAppDocuments(bool*)::close_queue,iVar25);
                  Text("%s",(*ppMVar18)->Name);
                }
              }
              EndChildFrame();
            }
            fVar34 = GetFontSize();
            doc = (MyDocument *)(ulong)(uint)(fVar34 * 7.0);
            bVar6 = Button("Yes",(ImVec2 *)&doc);
            if (bVar6) {
              for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::close_queue;
                  iVar25 = iVar25 + 1) {
                ppMVar18 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar25);
                if ((*ppMVar18)->Dirty == true) {
                  ppMVar18 = ImVector<MyDocument_*>::operator[]
                                       ((ImVector<MyDocument_*> *)
                                        &ShowExampleAppDocuments(bool*)::close_queue,iVar25);
                  (*ppMVar18)->Dirty = false;
                }
                ppMVar18 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar25);
                pMVar17 = *ppMVar18;
                pMVar17->Open = false;
                pMVar17->Dirty = false;
              }
              ImVector<MyDocument_*>::clear
                        ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            bVar6 = Button("No",(ImVec2 *)&doc);
            if (bVar6) {
              for (iVar25 = 0; iVar25 < ShowExampleAppDocuments(bool*)::close_queue;
                  iVar25 = iVar25 + 1) {
                ppMVar18 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar25);
                pMVar17 = *ppMVar18;
                pMVar17->Open = false;
                pMVar17->Dirty = false;
              }
              ImVector<MyDocument_*>::clear
                        ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            bVar6 = Button("Cancel",(ImVec2 *)&doc);
            if (bVar6) {
              ImVector<MyDocument_*>::clear
                        ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
              CloseCurrentPopup();
            }
            EndPopup();
          }
        }
      }
    }
LAB_001992af:
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar25 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar25 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar25 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar25 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    doc = (MyDocument *)0x43c8000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar6 = SmallButton("[Debug] Add 5 entries");
    if (bVar6) {
      iVar25 = 5;
      while (bVar6 = iVar25 != 0, iVar25 = iVar25 + -1, bVar6) {
        uVar10 = GetFrameCount();
        dVar3 = GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",
                   SUB84(dVar3,0),(ulong)uVar10);
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
      }
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
  }
  if (ShowDemoWindow::show_app_layout == true) {
    doc = (MyDocument *)0x43dc000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar6 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar6) {
      bVar6 = BeginMenuBar();
      if (bVar6) {
        bVar6 = BeginMenu("File",true);
        if (bVar6) {
          bVar6 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar6) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      doc = (MyDocument *)0x43160000;
      BeginChild("left pane",(ImVec2 *)&doc,true,0);
      uVar32 = 0;
      while (iVar25 = (int)uVar32, iVar25 != 100) {
        sprintf((char *)&doc,"MyObject %d",uVar32);
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        bVar6 = Selectable((char *)&doc,iVar25 == ShowExampleAppLayout(bool*)::selected,0,&canvas_sz
                          );
        if (bVar6) {
          ShowExampleAppLayout(bool*)::selected = iVar25;
        }
        uVar32 = (ulong)(iVar25 + 1);
      }
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar34 = GetFrameHeightWithSpacing();
      doc = (MyDocument *)((ulong)(uint)fVar34 << 0x20 ^ 0x8000000000000000);
      BeginChild("item view",(ImVec2 *)&doc,false,0);
      Text("MyObject: %d");
      Separator();
      bVar6 = BeginTabBar("##Tabs",0);
      if (bVar6) {
        bVar6 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar6) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar6 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar6) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      doc = (MyDocument *)0x0;
      Button("Revert",(ImVec2 *)&doc);
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      Button("Save",(ImVec2 *)&doc);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    doc = (MyDocument *)0x43e1000043d70000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar6 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar6) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      doc = (MyDocument *)0x4000000040000000;
      PushStyleVar(0xb,(ImVec2 *)&doc);
      doc = (MyDocument *)0x0;
      bVar6 = BeginTable("split",2,0x501,(ImVec2 *)&doc,0.0);
      if (bVar6) {
        for (iVar25 = 0; iVar25 != 4; iVar25 = iVar25 + 1) {
          ShowPlaceholderObject("Object",iVar25);
        }
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    doc = (MyDocument *)0x4416000044020000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar6 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar6) {
      if ((ShowExampleAppLongText(bool*)::log == '\0') &&
         (iVar25 = __cxa_guard_acquire(&ShowExampleAppLongText(bool*)::log), iVar25 != 0)) {
        _log = 0;
        uRam0000000000264210 = 0;
        __cxa_atexit(ImGuiTextBuffer::~ImGuiTextBuffer,&ShowExampleAppLongText(bool*)::log,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppLongText(bool*)::log);
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar32 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar32 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar32)
      ;
      doc = (MyDocument *)0x0;
      bVar6 = Button("Clear",(ImVec2 *)&doc);
      if (bVar6) {
        ImVector<char>::clear((ImVector<char> *)&ShowExampleAppLongText(bool*)::log);
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      bVar6 = Button("Add 1000 lines",(ImVec2 *)&doc);
      if (bVar6) {
        for (iVar25 = 0; iVar25 != 1000; iVar25 = iVar25 + 1) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar25));
        }
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      doc = (MyDocument *)0x0;
      BeginChild("Log",(ImVec2 *)&doc,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xe,(ImVec2 *)&doc);
        for (iVar25 = 0; iVar25 < (int)ShowExampleAppLongText(bool*)::lines; iVar25 = iVar25 + 1) {
          Text("%i The quick brown fox jumps over the lazy dog");
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xe,(ImVec2 *)&doc);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)&doc);
        ImGuiListClipper::Begin((ImGuiListClipper *)&doc,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar6 = ImGuiListClipper::Step((ImGuiListClipper *)&doc), bVar6) {
          for (iVar25 = (int)doc._0_4_; iVar25 < (int)doc._4_4_; iVar25 = iVar25 + 1) {
            Text("%i The quick brown fox jumps over the lazy dog");
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)&doc);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar28 = ImGuiTextBuffer::begin((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log);
        pcVar19 = ImGuiTextBuffer::end((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log);
        TextUnformatted(pcVar28,pcVar19);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar6 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar6) {
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      uVar32 = 0;
      for (iVar25 = 0; iVar25 < ShowExampleAppAutoResize(bool*)::lines; iVar25 = iVar25 + 1) {
        Text("%*sThis is line %d",uVar32,"");
        uVar32 = (ulong)((int)uVar32 + 4);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x209be5;
    IStack_c0 = (ImVec2)0x209bff;
    doc = (MyDocument *)anon_var_dwarf_f79bc;
    IStack_d0 = (ImVec2)0x209bce;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      canvas_sz.x = -1.0;
      canvas_sz.y = 0.0;
      gradient_size.x = -1.0;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      canvas_sz.x = 0.0;
      canvas_sz.y = -1.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = -1.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      canvas_sz.x = 100.0;
      canvas_sz.y = 100.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      canvas_sz.x = 400.0;
      canvas_sz.y = -1.0;
      gradient_size.x = 500.0;
      gradient_size.y = -1.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      canvas_sz.x = -1.0;
      canvas_sz.y = 400.0;
      gradient_size.x = -1.0;
      gradient_size.y = 500.0;
      SetNextWindowSizeConstraints(&canvas_sz,&gradient_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&canvas_sz,&gradient_size,
                 ShowExampleAppConstrainedResize::CustomConstraints::Square,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      gradient_size.x = 3.4028235e+38;
      gradient_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&canvas_sz,&gradient_size,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    bVar6 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar6) {
      bVar6 = IsWindowDocked();
      if (bVar6) {
        Text("Warning: Sizing Constraints won\'t work if the window is docked!");
      }
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar6 = Button("200x200",&canvas_sz);
      if (bVar6) {
        canvas_sz.x = 200.0;
        canvas_sz.y = 200.0;
        SetWindowSize(&canvas_sz,0);
      }
      SameLine(0.0,-1.0);
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar6 = Button("500x500",&canvas_sz);
      if (bVar6) {
        canvas_sz.x = 500.0;
        canvas_sz.y = 500.0;
        SetWindowSize(&canvas_sz,0);
      }
      SameLine(0.0,-1.0);
      canvas_sz.x = 0.0;
      canvas_sz.y = 0.0;
      bVar6 = Button("800x200",&canvas_sz);
      if (bVar6) {
        canvas_sz.x = 800.0;
        canvas_sz.y = 200.0;
        SetWindowSize(&canvas_sz,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)&doc,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      uVar10 = 0;
      for (iVar25 = 0; iVar25 < ShowExampleAppConstrainedResize(bool*)::display_lines;
          iVar25 = iVar25 + 1) {
        Text("%*sHello, sailor! Making this line long enough for the example.",(ulong)uVar10,"");
        uVar10 = uVar10 + 4;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar16 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0x2c116b;
    }
    else {
      pIVar15 = GetMainViewport();
      fVar34 = (pIVar15->WorkPos).x;
      fVar35 = (pIVar15->WorkPos).y;
      uVar10 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0);
      uVar24 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0);
      doc = (MyDocument *)
            CONCAT44(~uVar24 & (uint)((pIVar15->WorkSize).y + fVar35 + -10.0) |
                     (uint)(fVar35 + 10.0) & uVar24,
                     ~uVar10 & (uint)((pIVar15->WorkSize).x + fVar34 + -10.0) |
                     (uint)(fVar34 + 10.0) & uVar10);
      uVar32 = CONCAT44(~uVar24,~uVar10) & 0x3f8000003f800000;
      canvas_sz.x = (float)uVar32;
      canvas_sz.y = (float)(uVar32 >> 0x20);
      SetNextWindowPos((ImVec2 *)&doc,1,&canvas_sz);
      SetNextWindowViewport(pIVar15->ID);
      flags = 0x2c116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar6 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar6) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar6 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar6) {
        Text("Mouse Position: (%.1f,%.1f)",SUB84((double)(pIVar16->MousePos).x,0));
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar6 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar6) {
        bVar6 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar6 = MenuItem("Top-left",(char *)0x0,!bVar6 && uVar10 == 0,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar6 = MenuItem("Top-right",(char *)0x0,!bVar6 && uVar10 == 1,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar6 = MenuItem("Bottom-left",(char *)0x0,!bVar6 && uVar10 == 2,true);
        uVar10 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar6 = MenuItem("Bottom-right",(char *)0x0,!bVar6 && uVar10 == 3,true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar6 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar6) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_fullscreen == true) {
    pIVar15 = GetMainViewport();
    doc = (MyDocument *)0x0;
    SetNextWindowPos(&pIVar15->Pos + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0,
                     (ImVec2 *)&doc);
    SetNextWindowSize(&pIVar15->Size + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0);
    bVar6 = Begin("Example: Fullscreen window",&ShowDemoWindow::show_app_fullscreen,
                  ShowExampleAppFullscreen(bool*)::flags);
    if (bVar6) {
      Checkbox("Use work area instead of main area",
               (bool *)&ShowExampleAppFullscreen(bool*)::use_work_area);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
                );
      CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen(bool*)::flags,0x80);
      CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen(bool*)::flags,0x2b);
      Indent(0.0);
      CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen(bool*)::flags,1);
      CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen(bool*)::flags,0x20);
      CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen(bool*)::flags,8);
      Unindent(0.0);
      doc = (MyDocument *)0x0;
      bVar6 = Button("Close this window",(ImVec2 *)&doc);
      if (bVar6) {
        ShowDemoWindow::show_app_fullscreen = false;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    pIVar15 = GetMainViewport();
    fVar35 = (pIVar15->Pos).y;
    fVar34 = (pIVar15->Pos).x + 100.0;
    doc = (MyDocument *)CONCAT44(fVar35 + 100.0,fVar34);
    canvas_sz.x = 0.0;
    canvas_sz.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    doc = (MyDocument *)CONCAT44(fVar35 + 200.0,fVar34);
    canvas_sz.x = 0.0;
    canvas_sz.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar3 = GetTime();
    cVar1 = "|/-\\"[(int)(dVar3 * 4.0) & 3];
    GetFrameCount();
    sprintf((char *)&doc,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1);
    canvas_sz.y = fVar35 + 300.0;
    gradient_size.x = 0.0;
    gradient_size.y = 0.0;
    canvas_sz.x = fVar34;
    SetNextWindowPos(&canvas_sz,4,&gradient_size);
    Begin((char *)&doc,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_0019b4e7;
  bVar6 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if ((bVar6) && (bVar6 = BeginTabBar("##TabBar",0), bVar6)) {
    bVar6 = BeginTabItem("Primitives",(bool *)0x0,0);
    if (bVar6) {
      fVar34 = GetFontSize();
      PushItemWidth(fVar34 * -15.0);
      pIVar20 = GetWindowDrawList();
      iVar25 = 0;
      Text("Gradients");
      fVar34 = CalcItemWidth();
      fVar35 = GetFrameHeight();
      gradient_size.y = fVar35;
      gradient_size.x = fVar34;
      doc = (MyDocument *)GetCursorScreenPos();
      canvas_sz.x = fVar34 + SUB84(doc,0);
      canvas_sz.y = fVar35 + SUB84(doc,4);
      IVar11 = GetColorU32(0xff000000);
      IVar12 = GetColorU32(0xffffffff);
      ImDrawList::AddRectFilledMultiColor
                (pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,IVar12,IVar12,IVar11);
      InvisibleButton("##gradient1",&gradient_size,0);
      doc = (MyDocument *)GetCursorScreenPos();
      canvas_sz.x = gradient_size.x + SUB84(doc,0);
      canvas_sz.y = gradient_size.y + SUB84(doc,4);
      IVar11 = GetColorU32(0xff00ff00);
      IVar12 = GetColorU32(0xff0000ff);
      ImDrawList::AddRectFilledMultiColor
                (pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,IVar12,IVar12,IVar11);
      InvisibleButton("##gradient2",&gradient_size,0);
      Text("All primitives");
      if ((ShowExampleAppCustomRendering(bool*)::colf == '\0') &&
         (iVar27 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::colf), iVar27 != 0)) {
        ShowExampleAppCustomRendering(bool*)::colf._0_4_ = 0x3f800000;
        ShowExampleAppCustomRendering(bool*)::colf._4_4_ = 0x3f800000;
        ShowExampleAppCustomRendering(bool*)::colf._8_4_ = 0x3ecccccd;
        ShowExampleAppCustomRendering(bool*)::colf._12_4_ = 0x3f800000;
        __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::colf);
      }
      DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,100.0,"%.0f",0);
      DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",0)
      ;
      SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
      Checkbox("##circlesegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
      pIVar21 = GetStyle();
      SameLine(0.0,(pIVar21->ItemInnerSpacing).x);
      bVar6 = SliderInt("Circle segments override",
                        &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                        "%d",0);
      ShowExampleAppCustomRendering(bool*)::circle_segments_override =
           ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar6;
      Checkbox("##curvessegmentoverride",
               (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
      pIVar21 = GetStyle();
      SameLine(0.0,(pIVar21->ItemInnerSpacing).x);
      bVar6 = SliderInt("Curves segments override",
                        &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,"%d"
                        ,0);
      ShowExampleAppCustomRendering(bool*)::curve_segments_override =
           ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar6;
      ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
      IVar4 = GetCursorScreenPos();
      doc = (MyDocument *)
            CONCAT44(ShowExampleAppCustomRendering(bool*)::colf._4_4_,
                     ShowExampleAppCustomRendering(bool*)::colf._0_4_);
      IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
      IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
      IVar11 = ColorConvertFloat4ToU32((ImVec4 *)&doc);
      local_dc = 0;
      if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
        local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
      }
      iVar27 = 0;
      if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
        iVar27 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
      }
      local_4c = ShowExampleAppCustomRendering(bool*)::sz / 5.0;
      local_148 = IVar4.x;
      fStack_144 = IVar4.y;
      local_48._4_4_ = fStack_144;
      local_48._0_4_ = local_148 + 4.0;
      uStack_40 = extraout_XMM0_Dc;
      uStack_3c = extraout_XMM0_Dd;
      fStack_144 = fStack_144 + 4.0;
      for (; iVar25 != 2; iVar25 = iVar25 + 1) {
        fVar34 = 1.0;
        if (iVar25 != 0) {
          fVar34 = ShowExampleAppCustomRendering(bool*)::thickness;
        }
        fVar35 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar35 + fStack_144,fVar35 + (float)local_48._0_4_);
        ImDrawList::AddNgon(pIVar20,(ImVec2 *)&doc,fVar35,IVar11,
                            ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
        fVar35 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar35 + fStack_144,fVar35 + fVar36);
        ImDrawList::AddCircle(pIVar20,(ImVec2 *)&doc,fVar35,IVar11,local_dc,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        canvas_sz.x = fVar36 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        canvas_sz.x = fVar36 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,local_4c,0,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        canvas_sz.x = fVar36 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRect(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,local_4c,0x90,fVar34);
        fVar36 = fVar36 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_144 + -0.5;
        doc = (MyDocument *)
              CONCAT44(fStack_144,ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar36);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar36;
        local_58.y = canvas_sz.y;
        local_58.x = fVar36;
        ImDrawList::AddTriangle(pIVar20,(ImVec2 *)&doc,&canvas_sz,&local_58,IVar11,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar36;
        canvas_sz.y = fStack_144;
        ImDrawList::AddLine(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_144;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        canvas_sz.x = fVar36;
        ImDrawList::AddLine(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,fVar34);
        fVar36 = fVar36 + 10.0;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar36;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_144;
        ImDrawList::AddLine(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,fVar34);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        local_120.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fStack_144;
        local_118.x = fVar36 + ShowExampleAppCustomRendering(bool*)::sz;
        local_118.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fStack_144;
        local_120.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar36;
        canvas_sz.x = fVar36;
        ImDrawList::AddBezierQuadratic
                  (pIVar20,&canvas_sz,&local_120,&local_118,IVar11,fVar34,iVar27);
        fVar36 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar36;
        doc = (MyDocument *)CONCAT44(fStack_144,fVar36);
        IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fStack_144;
        IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + fVar36;
        local_c8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                     fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
        local_c8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                     ShowExampleAppCustomRendering(bool*)::sz + fVar36;
        IStack_c0.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
        IStack_c0.x = ShowExampleAppCustomRendering(bool*)::sz + fVar36;
        ImDrawList::AddBezierCubic
                  (pIVar20,(ImVec2 *)&doc,&IStack_d0,&local_c8,&IStack_c0,IVar11,fVar34,iVar27);
        fStack_144 = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      }
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      doc = (MyDocument *)CONCAT44(fVar34 + fStack_144,fVar34 + (float)local_48._0_4_);
      ImDrawList::AddNgonFilled
                (pIVar20,(ImVec2 *)&doc,fVar34,IVar11,
                 ShowExampleAppCustomRendering(bool*)::ngon_sides);
      local_48._0_4_ = (float)local_48._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
      doc = (MyDocument *)CONCAT44(fVar34 + fStack_144,fVar34 + (float)local_48._0_4_);
      ImDrawList::AddCircleFilled(pIVar20,(ImVec2 *)&doc,fVar34,IVar11,local_dc);
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34);
      canvas_sz.x = fVar34 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar34;
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34);
      canvas_sz.x = fVar34 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,10.0,0);
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar34;
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34);
      canvas_sz.x = fVar34 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,10.0,0x90);
      fVar34 = fVar34 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
      canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_144 + -0.5;
      doc = (MyDocument *)
            CONCAT44(fStack_144,ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar34);
      canvas_sz.x = ShowExampleAppCustomRendering(bool*)::sz + fVar34;
      local_58.y = canvas_sz.y;
      local_58.x = fVar34;
      ImDrawList::AddTriangleFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,&local_58,IVar11);
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar34;
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34);
      canvas_sz.x = fVar34 + ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = ShowExampleAppCustomRendering(bool*)::thickness + fStack_144;
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
      fVar34 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar34;
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34);
      canvas_sz.x = ShowExampleAppCustomRendering(bool*)::thickness + fVar34;
      canvas_sz.y = ShowExampleAppCustomRendering(bool*)::sz + fStack_144;
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
      fVar34 = fVar34 + 20.0;
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34);
      canvas_sz.x = fVar34 + 1.0;
      canvas_sz.y = fStack_144 + 1.0;
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&canvas_sz,IVar11,0.0,0);
      doc = (MyDocument *)CONCAT44(fStack_144,fVar34 + ShowExampleAppCustomRendering(bool*)::sz);
      canvas_sz.x = fVar34 + ShowExampleAppCustomRendering(bool*)::sz +
                    ShowExampleAppCustomRendering(bool*)::sz;
      canvas_sz.y = fStack_144 + ShowExampleAppCustomRendering(bool*)::sz;
      ImDrawList::AddRectFilledMultiColor
                (pIVar20,(ImVec2 *)&doc,&canvas_sz,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
      doc = (MyDocument *)
            CONCAT44((ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0,
                     (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2);
      Dummy((ImVec2 *)&doc);
      PopItemWidth();
      EndTabItem();
    }
    bVar6 = BeginTabItem("Canvas",(bool *)0x0,0);
    if (bVar6) {
      if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
         (iVar25 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar25 != 0))
      {
        _points = 0;
        uRam0000000000264260 = 0;
        __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering(bool*)::points,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
      }
      if ((ShowExampleAppCustomRendering(bool*)::scrolling == '\0') &&
         (iVar25 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::scrolling),
         iVar25 != 0)) {
        _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 = 0.0;
        _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 = 0.0;
        __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::scrolling);
      }
      Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
      Checkbox("Enable context menu",
               (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
      Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");
      doc = (MyDocument *)GetCursorScreenPos();
      IVar4 = GetContentRegionAvail();
      canvas_sz.x = IVar4.x;
      canvas_sz.y = IVar4.y;
      if (canvas_sz.x < 50.0) {
        canvas_sz.x = 50.0;
      }
      if (canvas_sz.y < 50.0) {
        canvas_sz.y = 50.0;
      }
      gradient_size.y = (float)((ulong)doc >> 0x20) + canvas_sz.y;
      gradient_size.x = SUB84(doc,0) + canvas_sz.x;
      pIVar16 = GetIO();
      pIVar20 = GetWindowDrawList();
      ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&doc,&gradient_size,0xff323232,0.0,0);
      ImDrawList::AddRect(pIVar20,(ImVec2 *)&doc,&gradient_size,0xffffffff,0.0,0,1.0);
      InvisibleButton("canvas",&canvas_sz,3);
      bVar6 = IsItemHovered(0);
      bVar7 = IsItemActive();
      fVar34 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + SUB84(doc,0);
      fVar35 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + (float)((ulong)doc >> 0x20);
      local_58.y = (pIVar16->MousePos).y - fVar35;
      local_58.x = (pIVar16->MousePos).x - fVar34;
      if (bVar6) {
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\0') {
          bVar6 = IsMouseClicked(0,false);
          if (!bVar6) goto LAB_0019b03f;
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_58);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_58);
          ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
        }
LAB_0019b048:
        pIVar22 = ImVector<ImVec2>::back
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
        *pIVar22 = local_58;
        bVar6 = IsMouseDown(0);
        if (!bVar6) {
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        }
      }
      else {
LAB_0019b03f:
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') goto LAB_0019b048;
      }
      if (bVar7) {
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
          fVar36 = 0.0;
        }
        else {
          fVar36 = -1.0;
        }
        bVar6 = IsMouseDragging(1,fVar36);
        if (bVar6) {
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
               (pIVar16->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
          _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
               (pIVar16->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
        }
      }
      IVar4 = GetMouseDragDelta(1,-1.0);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') {
        bVar6 = IsMouseReleased(1);
        local_138 = IVar4.x;
        fStack_134 = IVar4.y;
        if ((((bVar6) && (local_138 == 0.0)) && (!NAN(local_138))) &&
           ((fStack_134 == 0.0 && (!NAN(fStack_134))))) {
          OpenPopupOnItemClick("context",1);
        }
      }
      bVar6 = BeginPopup("context",0);
      if (bVar6) {
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          ImVector<ImVec2>::resize
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                     ShowExampleAppCustomRendering(bool*)::points + -2);
        }
        ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
        bVar6 = MenuItem("Remove one",(char *)0x0,false,
                         0 < ShowExampleAppCustomRendering(bool*)::points);
        if (bVar6) {
          ImVector<ImVec2>::resize
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                     ShowExampleAppCustomRendering(bool*)::points + -2);
        }
        bVar6 = MenuItem("Remove all",(char *)0x0,false,
                         0 < ShowExampleAppCustomRendering(bool*)::points);
        if (bVar6) {
          ImVector<ImVec2>::clear((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points)
          ;
        }
        EndPopup();
      }
      ImDrawList::PushClipRect(pIVar20,(ImVec2)doc,gradient_size,true);
      if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
        fVar36 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
        for (; fVar36 < canvas_sz.x; fVar36 = fVar36 + 64.0) {
          local_e8.y = doc._4_4_;
          local_e8.x = doc._0_4_ + fVar36;
          local_f0.y = gradient_size.y;
          local_f0.x = doc._0_4_ + fVar36;
          ImDrawList::AddLine(pIVar20,&local_e8,&local_f0,0x28c8c8c8,1.0);
        }
        fVar36 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
        for (; fVar36 < canvas_sz.y; fVar36 = fVar36 + 64.0) {
          local_e8.y = doc._4_4_ + fVar36;
          local_e8.x = SUB84(doc,0);
          local_f0.y = doc._4_4_ + fVar36;
          local_f0.x = gradient_size.x;
          ImDrawList::AddLine(pIVar20,&local_e8,&local_f0,0x28c8c8c8,1.0);
        }
      }
      for (iVar25 = 0; iVar25 < ShowExampleAppCustomRendering(bool*)::points; iVar25 = iVar25 + 2) {
        pIVar22 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar25);
        fVar36 = pIVar22->x;
        pIVar22 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar25);
        local_e8.y = pIVar22->y + fVar35;
        local_e8.x = fVar36 + fVar34;
        pIVar22 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar25 + 1);
        fVar36 = pIVar22->x;
        pIVar22 = ImVector<ImVec2>::operator[]
                            ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                             iVar25 + 1);
        local_f0.y = pIVar22->y + fVar35;
        local_f0.x = fVar36 + fVar34;
        ImDrawList::AddLine(pIVar20,&local_e8,&local_f0,0xff00ffff,2.0);
      }
      ImDrawList::PopClipRect(pIVar20);
      EndTabItem();
    }
    bVar6 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
    if (bVar6) {
      Checkbox("Draw in Background draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
      Checkbox("Draw in Foreground draw list",(bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg
              );
      SameLine(0.0,-1.0);
      HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
      IVar4 = GetWindowPos();
      IVar5 = GetWindowSize();
      local_138 = IVar4.x;
      fStack_134 = IVar4.y;
      doc = (MyDocument *)CONCAT44(IVar5.y * 0.5 + fStack_134,IVar5.x * 0.5 + local_138);
      if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
        pIVar20 = GetBackgroundDrawList();
        ImDrawList::AddCircle(pIVar20,(ImVec2 *)&doc,IVar5.x * 0.6,0xc80000ff,0,14.0);
      }
      if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
        pIVar20 = GetForegroundDrawList();
        ImDrawList::AddCircle(pIVar20,(ImVec2 *)&doc,IVar5.y * 0.6,0xc800ff00,0,10.0);
      }
      EndTabItem();
    }
    EndTabBar();
  }
  End();
LAB_0019b4e7:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_stack_tool == true) {
    ShowStackToolWindow(&ShowDemoWindow::show_app_stack_tool);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar10 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar10 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar24 = uVar10 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar24 = uVar10;
  }
  uVar10 = uVar24 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar10 = uVar24;
  }
  uVar24 = uVar10 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar24 = uVar10;
  }
  uVar10 = uVar24 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar10 = uVar24;
  }
  uVar24 = uVar10 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar24 = uVar10;
  }
  uVar10 = uVar24 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar10 = uVar24;
  }
  uVar24 = uVar10 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar24 = uVar10;
  }
  uVar10 = uVar24 | 0x200000;
  if (ShowDemoWindow::no_docking == false) {
    uVar10 = uVar24;
  }
  uVar24 = uVar10 | 0x100000;
  if (ShowDemoWindow::unsaved_document == false) {
    uVar24 = uVar10;
  }
  pbVar26 = local_38;
  if (ShowDemoWindow::no_close != false) {
    pbVar26 = (bool *)0x0;
  }
  pIVar15 = GetMainViewport();
  doc = (MyDocument *)CONCAT44((pIVar15->WorkPos).y + 20.0,(pIVar15->WorkPos).x + 650.0);
  canvas_sz.x = 0.0;
  canvas_sz.y = 0.0;
  SetNextWindowPos((ImVec2 *)&doc,4,&canvas_sz);
  doc = (MyDocument *)0x442a000044098000;
  SetNextWindowSize((ImVec2 *)&doc,4);
  bVar6 = Begin("Dear ImGui Demo",pbVar26,uVar24);
  if (bVar6) {
    fVar34 = GetFontSize();
    PushItemWidth(fVar34 * -12.0);
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("Menu",true);
      if (bVar6) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar6 = BeginMenu("Examples",true);
      if (bVar6) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Fullscreen window",(char *)0x0,&ShowDemoWindow::show_app_fullscreen,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Dockspace",(char *)0x0,&ShowDemoWindow::show_app_dockspace,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar6 = BeginMenu("Tools",true);
      if (bVar6) {
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Stack Tool",(char *)0x0,&ShowDemoWindow::show_app_stack_tool,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar6 = CollapsingHeader("Help",0);
    if (bVar6) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar6 = CollapsingHeader("Configuration",0);
    if (bVar6) {
      pIVar16 = GetIO();
      bVar6 = TreeNode("Configuration##2");
      if (bVar6) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar16->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar16->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar16->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar16->ConfigFlags,0x10);
        if ((pIVar16->ConfigFlags & 0x10) != 0) {
          dVar3 = GetTime();
          fVar34 = fmodf((float)dVar3,0.4);
          if (fVar34 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar25 = GetKeyIndex(0xc);
          bVar6 = IsKeyPressed(iVar25,true);
          if (bVar6) {
            *(byte *)&pIVar16->ConfigFlags = (byte)pIVar16->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar16->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        CheckboxFlags("io.ConfigFlags: DockingEnable",&pIVar16->ConfigFlags,0x40);
        SameLine(0.0,-1.0);
        pcVar28 = 
        "Drag from window title bar or their tab to dock/undock. Hold SHIFT to disable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows)."
        ;
        if (pIVar16->ConfigDockingWithShift != false) {
          pcVar28 = 
          "Drag from window title bar or their tab to dock/undock. Hold SHIFT to enable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows)."
          ;
        }
        HelpMarker(pcVar28);
        if ((pIVar16->ConfigFlags & 0x40) != 0) {
          Indent(0.0);
          Checkbox("io.ConfigDockingNoSplit",&pIVar16->ConfigDockingNoSplit);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Simplified docking mode: disable window splitting, so docking is limited to merging multiple windows together into tab-bars."
                    );
          Checkbox("io.ConfigDockingWithShift",&pIVar16->ConfigDockingWithShift);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Enable docking when holding Shift only (allow to drop in wider space, reduce visual noise)"
                    );
          Checkbox("io.ConfigDockingAlwaysTabBar",&pIVar16->ConfigDockingAlwaysTabBar);
          SameLine(0.0,-1.0);
          HelpMarker("Create a docking node and tab-bar on single floating windows.");
          Checkbox("io.ConfigDockingTransparentPayload",&pIVar16->ConfigDockingTransparentPayload);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Make window or viewport transparent when docking and only display docking boxes on the target viewport. Useful if rendering of multiple viewport cannot be synced. Best used with ConfigViewportsNoAutoMerge."
                    );
          Unindent(0.0);
        }
        CheckboxFlags("io.ConfigFlags: ViewportsEnable",&pIVar16->ConfigFlags,0x400);
        SameLine(0.0,-1.0);
        HelpMarker("[beta] Enable beta multi-viewports support. See ImGuiPlatformIO for details.");
        if ((pIVar16->ConfigFlags & 0x400) != 0) {
          Indent(0.0);
          Checkbox("io.ConfigViewportsNoAutoMerge",&pIVar16->ConfigViewportsNoAutoMerge);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Set to make all floating imgui windows always create their own viewport. Otherwise, they are merged into the main host viewports when overlapping it."
                    );
          Checkbox("io.ConfigViewportsNoTaskBarIcon",&pIVar16->ConfigViewportsNoTaskBarIcon);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the task bar icon state right away)."
                    );
          Checkbox("io.ConfigViewportsNoDecoration",&pIVar16->ConfigViewportsNoDecoration);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the decoration right away)."
                    );
          Checkbox("io.ConfigViewportsNoDefaultParent",&pIVar16->ConfigViewportsNoDefaultParent);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Toggling this at runtime is normally unsupported (most platform backends won\'t refresh the parenting right away)."
                    );
          Unindent(0.0);
        }
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar16->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
        Checkbox("io.ConfigDragClickToInputText",&pIVar16->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar16->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar16->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar16->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Backend Flags");
      if (bVar6) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose them as read-only fields to avoid breaking interactions with your backend."
                  );
        doc = (MyDocument *)CONCAT44(doc._4_4_,pIVar16->BackendFlags);
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)&doc,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)&doc,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)&doc,4);
        CheckboxFlags("io.BackendFlags: PlatformHasViewports",(int *)&doc,0x400);
        CheckboxFlags("io.BackendFlags: HasMouseHoveredViewport",(int *)&doc,0x800);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)&doc,8);
        CheckboxFlags("io.BackendFlags: RendererHasViewports",(int *)&doc,0x1000);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Style");
      if (bVar6) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Capture/Logging");
      if (bVar6) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        doc = (MyDocument *)0x0;
        bVar6 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)&doc);
        if (bVar6) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar6 = CollapsingHeader("Window options",0);
    if (bVar6) {
      doc = (MyDocument *)0x0;
      bVar6 = BeginTable("split",3,0,(ImVec2 *)&doc,0.0);
      if (bVar6) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        TableNextColumn();
        Checkbox("No docking",&ShowDemoWindow::no_docking);
        TableNextColumn();
        Checkbox("Unsaved document",&ShowDemoWindow::unsaved_document);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar6 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar6) {
      bVar6 = TreeNode("Popups");
      if (bVar6) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        doc = (MyDocument *)0x0;
        bVar6 = Button("Select..",(ImVec2 *)&doc);
        if (bVar6) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar28 = "<None>";
        }
        else {
          pcVar28 = (&PTR_anon_var_dwarf_f0124_0024e7b0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar28,(char *)0x0);
        bVar6 = BeginPopup("my_select_popup",0);
        if (bVar6) {
          Text("Aquarium");
          Separator();
          ppuVar33 = &PTR_anon_var_dwarf_f0124_0024e7b0;
          for (lVar31 = 0; lVar31 != 5; lVar31 = lVar31 + 1) {
            doc = (MyDocument *)0x0;
            bVar6 = Selectable(*ppuVar33,false,0,(ImVec2 *)&doc);
            if (bVar6) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar31;
            }
            ppuVar33 = ppuVar33 + 1;
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar6 = Button("Toggle..",(ImVec2 *)&doc);
        if (bVar6) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar6 = BeginPopup("my_toggle_popup",0);
        if (bVar6) {
          pbVar26 = (bool *)&ShowDemoWindowPopups()::toggles;
          for (lVar31 = 0; lVar31 != 0x28; lVar31 = lVar31 + 8) {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_f0124_0024e7b0 + lVar31),"",pbVar26,true);
            pbVar26 = pbVar26 + 1;
          }
          bVar6 = BeginMenu("Sub-menu",true);
          if (bVar6) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            SetTooltip("I am a tooltip over a popup");
          }
          doc = (MyDocument *)0x0;
          bVar6 = Button("Stacked Popup",(ImVec2 *)&doc);
          if (bVar6) {
            OpenPopup("another popup",0);
          }
          bVar6 = BeginPopup("another popup",0);
          if (bVar6) {
            pbVar26 = (bool *)&ShowDemoWindowPopups()::toggles;
            for (lVar31 = 0; lVar31 != 0x28; lVar31 = lVar31 + 8) {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_f0124_0024e7b0 + lVar31),"",pbVar26,true
                      );
              pbVar26 = pbVar26 + 1;
            }
            bVar6 = BeginMenu("Sub-menu",true);
            if (bVar6) {
              MenuItem("Click me",(char *)0x0,false,true);
              doc = (MyDocument *)0x0;
              bVar6 = Button("Stacked Popup",(ImVec2 *)&doc);
              if (bVar6) {
                OpenPopup("another popup",0);
              }
              bVar6 = BeginPopup("another popup",0);
              if (bVar6) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar6 = Button("File Menu..",(ImVec2 *)&doc);
        if (bVar6) {
          OpenPopup("my_file_popup",0);
        }
        bVar6 = BeginPopup("my_file_popup",0);
        if (bVar6) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Context menus");
      if (bVar6) {
        HelpMarker(
                  "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                  );
        for (lVar31 = 0; lVar31 != 0x28; lVar31 = lVar31 + 8) {
          pcVar28 = *(char **)((long)&PTR_anon_var_dwarf_f0238_0024e7e0 + lVar31);
          doc = (MyDocument *)0x0;
          Selectable(pcVar28,false,0,(ImVec2 *)&doc);
          bVar6 = BeginPopupContextItem((char *)0x0,1);
          if (bVar6) {
            Text("This a popup for \"%s\"!",pcVar28);
            doc = (MyDocument *)0x0;
            bVar6 = Button("Close",(ImVec2 *)&doc);
            if (bVar6) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            SetTooltip("Right-click to open popup");
          }
        }
        HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
        Text("Value = %.3f <-- (1) right-click this value",
             SUB84((double)ShowDemoWindowPopups()::value,0));
        bVar6 = BeginPopupContextItem("my popup",1);
        if (bVar6) {
          doc = (MyDocument *)0x0;
          bVar6 = Selectable("Set to zero",false,0,(ImVec2 *)&doc);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          doc = (MyDocument *)0x0;
          bVar6 = Selectable("Set to PI",false,0,(ImVec2 *)&doc);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.1754944e-38);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(2) Or right-click this text");
        OpenPopupOnItemClick("my popup",1);
        doc = (MyDocument *)0x0;
        bVar6 = Button("(3) Or click this button",(ImVec2 *)&doc);
        if (bVar6) {
          OpenPopup("my popup",0);
        }
        HelpMarker(
                  "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                  );
        sprintf((char *)&doc,"Button: %s###Button",ShowDemoWindowPopups()::name);
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        Button((char *)&doc,&canvas_sz);
        bVar6 = BeginPopupContextItem((char *)0x0,1);
        if (bVar6) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,
                    (ImGuiInputTextCallback_conflict1)0x0,(void *)0x0);
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar6 = Button("Close",&canvas_sz);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar6 = TreeNode("Modals");
      if (bVar6) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        doc = (MyDocument *)0x0;
        bVar6 = Button("Delete..",(ImVec2 *)&doc);
        if (bVar6) {
          OpenPopup("Delete?",0);
        }
        pIVar15 = GetMainViewport();
        doc = (MyDocument *)
              CONCAT44((pIVar15->Size).y * 0.5 + (pIVar15->Pos).y,
                       (pIVar15->Size).x * 0.5 + (pIVar15->Pos).x);
        canvas_sz.x = 0.5;
        canvas_sz.y = 0.5;
        SetNextWindowPos((ImVec2 *)&doc,8,&canvas_sz);
        bVar6 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar6) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          PushStyleVar(0xb,&canvas_sz);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          canvas_sz.x = 120.0;
          canvas_sz.y = 0.0;
          bVar6 = Button("OK",&canvas_sz);
          if (bVar6) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          canvas_sz.x = 120.0;
          canvas_sz.y = 0.0;
          bVar6 = Button("Cancel",&canvas_sz);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        canvas_sz.x = 0.0;
        canvas_sz.y = 0.0;
        bVar6 = Button("Stacked modals..",&canvas_sz);
        if (bVar6) {
          OpenPopup("Stacked 1",0);
        }
        bVar6 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar6) {
          bVar6 = BeginMenuBar();
          if (bVar6) {
            bVar6 = BeginMenu("File",true);
            if (bVar6) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar6 = Button("Add another modal..",&canvas_sz);
          if (bVar6) {
            OpenPopup("Stacked 2",0);
          }
          gradient_size.x._0_1_ = 1;
          bVar6 = BeginPopupModal("Stacked 2",(bool *)&gradient_size,0);
          if (bVar6) {
            Text("Hello from Stacked The Second!");
            canvas_sz.x = 0.0;
            canvas_sz.y = 0.0;
            bVar6 = Button("Close",&canvas_sz);
            if (bVar6) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          bVar6 = Button("Close",&canvas_sz);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Menus inside a regular window");
      if (bVar6) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar6 = BeginMenu("Menu inside a regular window",true);
        if (bVar6) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    bVar6 = CollapsingHeader("Filtering",0);
    if (bVar6) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar25 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar25 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 8) {
        bVar6 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_f6015_0024ea80 + lVar31),(char *)0x0
                          );
        if (bVar6) {
          BulletText("%s");
        }
      }
    }
    bVar6 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar6) {
      pIVar16 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar16->WantCaptureMouse);
      Text("WantCaptureMouseUnlessPopupClose: %d",(ulong)pIVar16->WantCaptureMouseUnlessPopupClose);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar16->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar16->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar16->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar16->NavActive,(ulong)pIVar16->NavVisible);
      bVar6 = TreeNode("Mouse State");
      if (bVar6) {
        bVar6 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar6) {
          Text("Mouse pos: (%g, %g)",SUB84((double)(pIVar16->MousePos).x,0),
               SUB84((double)(pIVar16->MousePos).y,0));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",SUB84((double)(pIVar16->MouseDelta).x,0));
        Text("Mouse down:");
        for (lVar31 = 0; lVar31 != 5; lVar31 = lVar31 + 1) {
          bVar6 = IsMouseDown((ImGuiMouseButton)lVar31);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",SUB84((double)pIVar16->MouseDownDuration[lVar31],0));
          }
        }
        Text("Mouse clicked:");
        for (iVar25 = 0; iVar25 != 5; iVar25 = iVar25 + 1) {
          bVar6 = IsMouseClicked(iVar25,false);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
        }
        Text("Mouse dblclick:");
        for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
          bVar6 = IsMouseDoubleClicked(uVar10);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar10);
          }
        }
        Text("Mouse released:");
        uVar32 = 0;
        while (iVar25 = (int)uVar32, iVar25 != 5) {
          bVar6 = IsMouseReleased(iVar25);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d",uVar32);
          }
          uVar32 = (ulong)(iVar25 + 1);
        }
        Text("Mouse wheel: %.1f",SUB84((double)pIVar16->MouseWheel,0));
        Text("Pen Pressure: %.1f",SUB84((double)pIVar16->PenPressure,0));
        TreePop();
      }
      bVar6 = TreeNode("Keyboard & Navigation State");
      if (bVar6) {
        Text("Keys down:");
        for (uVar32 = 0; uVar32 != 0x200; uVar32 = uVar32 + 1) {
          bVar6 = IsKeyDown((int)uVar32);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",SUB84((double)pIVar16->KeysDownDuration[uVar32],0),
                 uVar32 & 0xffffffff,uVar32 & 0xffffffff);
          }
        }
        Text("Keys pressed:");
        for (uVar10 = 0; uVar10 != 0x200; uVar10 = uVar10 + 1) {
          bVar6 = IsKeyPressed(uVar10,true);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar10,(ulong)uVar10);
          }
        }
        Text("Keys release:");
        for (uVar10 = 0; uVar10 != 0x200; uVar10 = uVar10 + 1) {
          bVar6 = IsKeyReleased(uVar10);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar10,(ulong)uVar10);
          }
        }
        pcVar28 = "CTRL ";
        if (pIVar16->KeyCtrl == false) {
          pcVar28 = "";
        }
        pcVar19 = "SHIFT ";
        if (pIVar16->KeyShift == false) {
          pcVar19 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar28,pcVar19);
        Text("Chars queue:");
        for (iVar25 = 0; iVar25 < (pIVar16->InputQueueCharacters).Size; iVar25 = iVar25 + 1) {
          puVar23 = ImVector<unsigned_short>::operator[](&pIVar16->InputQueueCharacters,iVar25);
          uVar2 = *puVar23;
          SameLine(0.0,-1.0);
          uVar32 = (ulong)(uint)(int)(char)uVar2;
          if (0xde < (ushort)(uVar2 - 0x21)) {
            uVar32 = 0x3f;
          }
          Text("\'%c\' (0x%04X)",uVar32,(ulong)uVar2);
        }
        Text("NavInputs down:");
        for (uVar32 = 0; uVar32 != 0x14; uVar32 = uVar32 + 1) {
          if (0.0 < pIVar16->NavInputs[uVar32]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f (%.02f secs)",SUB84((double)pIVar16->NavInputs[uVar32],0),
                 uVar32 & 0xffffffff);
          }
        }
        Text("NavInputs pressed:");
        for (uVar32 = 0; uVar32 != 0x14; uVar32 = uVar32 + 1) {
          if ((pIVar16->NavInputsDownDuration[uVar32] == 0.0) &&
             (!NAN(pIVar16->NavInputsDownDuration[uVar32]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar32 & 0xffffffff);
          }
        }
        doc = (MyDocument *)0x0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)&doc);
        bVar6 = IsItemHovered(0);
        if (bVar6) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)&doc);
        bVar6 = IsItemActive();
        if (bVar6) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar6 = TreeNode("Tabbing");
      if (bVar6) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,
                  (ImGuiInputTextCallback_conflict1)0x0,(void *)0x0);
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        TreePop();
      }
      bVar6 = TreeNode("Focus from code");
      if (bVar6) {
        doc = (MyDocument *)0x0;
        bVar6 = Button("Focus on 1",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar7 = Button("Focus on 2",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar8 = Button("Focus on 3",(ImVec2 *)&doc);
        if (bVar6) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        bVar6 = IsItemActive();
        if (bVar7) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback_conflict1)0x0,
                  (void *)0x0);
        bVar7 = IsItemActive();
        uVar10 = (uint)bVar6;
        if (bVar7) {
          uVar10 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar8) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,
                  (ImGuiInputTextCallback_conflict1)0x0,(void *)0x0);
        bVar6 = IsItemActive();
        if (bVar6) {
          uVar10 = 3;
        }
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        if (uVar10 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar10);
        }
        doc = (MyDocument *)0x0;
        bVar6 = Button("Focus on X",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar7 = Button("Focus on Y",(ImVec2 *)&doc);
        iVar25 = 1;
        if (!bVar7) {
          iVar25 = bVar6 - 1;
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar6 = Button("Focus on Z",(ImVec2 *)&doc);
        if (bVar6) {
          iVar25 = 2;
        }
        if (iVar25 != -1) {
          SetKeyboardFocusHere(iVar25);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar6 = TreeNode("Dragging");
      if (bVar6) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
          Text("IsMouseDragging(%d):",(ulong)uVar10);
          bVar6 = IsMouseDragging(uVar10,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar6);
          bVar6 = IsMouseDragging(uVar10,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar6);
          bVar6 = IsMouseDragging(uVar10,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar6);
        }
        doc = (MyDocument *)0x0;
        Button("Drag Me",(ImVec2 *)&doc);
        bVar6 = IsItemActive();
        if (bVar6) {
          pIVar20 = GetForegroundDrawList();
          IVar11 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar20,pIVar16->MouseClickedPos,&pIVar16->MousePos,IVar11,4.0);
        }
        IVar4 = GetMouseDragDelta(0,0.0);
        IVar5 = GetMouseDragDelta(0,-1.0);
        uStack_40 = extraout_XMM0_Dc_00;
        local_48._0_4_ = IVar5.x;
        local_48._4_4_ = IVar5.y;
        uStack_3c = extraout_XMM0_Dd_00;
        fVar34 = (pIVar16->MouseDelta).x;
        fVar35 = (pIVar16->MouseDelta).y;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",SUB84((double)(float)local_48._0_4_,0),
             SUB84((double)(float)local_48._4_4_,0));
        local_108 = IVar4.x;
        fStack_104 = IVar4.y;
        Text("  w/ zero threshold: (%.1f, %.1f)",SUB84((double)local_108,0),
             SUB84((double)fStack_104,0));
        Text("io.MouseDelta: (%.1f, %.1f)",SUB84((double)fVar34,0),SUB84((double)fVar35,0));
        TreePop();
      }
      bVar6 = TreeNode("Mouse cursors");
      if (bVar6) {
        IVar13 = GetMouseCursor();
        puVar29 = &DAT_0024eac0;
        Text("Current mouse cursor = %d: %s",(long)IVar13,(&DAT_0024eac0)[IVar13]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        for (uVar32 = 0; uVar32 != 9; uVar32 = uVar32 + 1) {
          sprintf((char *)&doc,"Mouse cursor %d: %s",uVar32 & 0xffffffff,*puVar29);
          Bullet();
          canvas_sz.x = 0.0;
          canvas_sz.y = 0.0;
          Selectable((char *)&doc,false,0,&canvas_sz);
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            SetMouseCursor((ImGuiMouseCursor)uVar32);
          }
          puVar29 = puVar29 + 1;
        }
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_dockspace = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_dockspace)           ShowExampleAppDockSpace(&show_app_dockspace);     // Process the Docking app first, as explicit DockSpace() nodes needs to be submitted early (read comments near the DockSpace function)
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);     // Process the Document app next, as it may also use a DockSpace()

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool no_docking = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_docking)         window_flags |= ImGuiWindowFlags_NoDocking;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Dockspace", NULL, &show_app_dockspace);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");

            ImGui::CheckboxFlags("io.ConfigFlags: DockingEnable", &io.ConfigFlags, ImGuiConfigFlags_DockingEnable);
            ImGui::SameLine();
            if (io.ConfigDockingWithShift)
                HelpMarker("Drag from window title bar or their tab to dock/undock. Hold SHIFT to enable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows).");
            else
                HelpMarker("Drag from window title bar or their tab to dock/undock. Hold SHIFT to disable docking.\n\nDrag from window menu button (upper-left button) to undock an entire node (all windows).");
            if (io.ConfigFlags & ImGuiConfigFlags_DockingEnable)
            {
                ImGui::Indent();
                ImGui::Checkbox("io.ConfigDockingNoSplit", &io.ConfigDockingNoSplit);
                ImGui::SameLine(); HelpMarker("Simplified docking mode: disable window splitting, so docking is limited to merging multiple windows together into tab-bars.");
                ImGui::Checkbox("io.ConfigDockingWithShift", &io.ConfigDockingWithShift);
                ImGui::SameLine(); HelpMarker("Enable docking when holding Shift only (allow to drop in wider space, reduce visual noise)");
                ImGui::Checkbox("io.ConfigDockingAlwaysTabBar", &io.ConfigDockingAlwaysTabBar);
                ImGui::SameLine(); HelpMarker("Create a docking node and tab-bar on single floating windows.");
                ImGui::Checkbox("io.ConfigDockingTransparentPayload", &io.ConfigDockingTransparentPayload);
                ImGui::SameLine(); HelpMarker("Make window or viewport transparent when docking and only display docking boxes on the target viewport. Useful if rendering of multiple viewport cannot be synced. Best used with ConfigViewportsNoAutoMerge.");
                ImGui::Unindent();
            }

            ImGui::CheckboxFlags("io.ConfigFlags: ViewportsEnable", &io.ConfigFlags, ImGuiConfigFlags_ViewportsEnable);
            ImGui::SameLine(); HelpMarker("[beta] Enable beta multi-viewports support. See ImGuiPlatformIO for details.");
            if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)
            {
                ImGui::Indent();
                ImGui::Checkbox("io.ConfigViewportsNoAutoMerge", &io.ConfigViewportsNoAutoMerge);
                ImGui::SameLine(); HelpMarker("Set to make all floating imgui windows always create their own viewport. Otherwise, they are merged into the main host viewports when overlapping it.");
                ImGui::Checkbox("io.ConfigViewportsNoTaskBarIcon", &io.ConfigViewportsNoTaskBarIcon);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the task bar icon state right away).");
                ImGui::Checkbox("io.ConfigViewportsNoDecoration", &io.ConfigViewportsNoDecoration);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the decoration right away).");
                ImGui::Checkbox("io.ConfigViewportsNoDefaultParent", &io.ConfigViewportsNoDefaultParent);
                ImGui::SameLine(); HelpMarker("Toggling this at runtime is normally unsupported (most platform backends won't refresh the parenting right away).");
                ImGui::Unindent();
            }

            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",             &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",        &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",         &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: PlatformHasViewports",   &backend_flags, ImGuiBackendFlags_PlatformHasViewports);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseHoveredViewport",&backend_flags, ImGuiBackendFlags_HasMouseHoveredViewport);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",   &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasViewports",   &backend_flags, ImGuiBackendFlags_RendererHasViewports);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("No docking", &no_docking);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}